

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O0

void endian_swap(uint64_t *x)

{
  uint64_t *x_local;
  
  *x = *x >> 0x38 | (*x & 0xff00) << 0x28 | (*x & 0xff0000) << 0x18 | (*x & 0xff000000) << 8 |
       *x >> 8 & 0xff000000 | *x >> 0x18 & 0xff0000 | *x >> 0x28 & 0xff00 | *x << 0x38;
  return;
}

Assistant:

inline void endian_swap(uint64_t &x)
{
    x = (x>>56) | 
        ((x<<40) & 0x00FF000000000000) |
        ((x<<24) & 0x0000FF0000000000) |
        ((x<<8)  & 0x000000FF00000000) |
        ((x>>8)  & 0x00000000FF000000) |
        ((x>>24) & 0x0000000000FF0000) |
        ((x>>40) & 0x000000000000FF00) |
        (x<<56);
}